

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void bfgs_iter_start<dense_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  float fVar2;
  weight *pwVar3;
  uint32_t uVar4;
  int iVar5;
  weight *pwVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  *origin = 0;
  pwVar3 = weights->_begin;
  uVar4 = weights->_stride_shift;
  dVar10 = 0.0;
  dVar11 = 0.0;
  pwVar6 = pwVar3;
  for (lVar9 = 0; (float *)((long)pwVar3 + lVar9) != pwVar6 + weights->_weight_mask + 1;
      lVar9 = lVar9 + (1L << ((byte)uVar4 & 0x3f)) * 4) {
    iVar8 = b->mem_stride;
    lVar7 = ((ulong)(lVar9 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar8;
    iVar5 = *origin;
    if (0 < b->m) {
      mem[lVar7 + (iVar5 + 1) % iVar8] = *(float *)((long)pwVar3 + lVar9);
      iVar5 = *origin;
      iVar8 = b->mem_stride;
    }
    fVar1 = *(float *)((long)pwVar3 + lVar9 + 4);
    mem[lVar7 + iVar5 % iVar8] = fVar1;
    fVar2 = *(float *)((long)pwVar3 + lVar9 + 0xc);
    dVar12 = (double)fVar1;
    *(float *)((long)pwVar3 + lVar9 + 8) = -fVar2 * fVar1;
    *(undefined4 *)((long)pwVar3 + lVar9 + 4) = 0;
    dVar10 = dVar10 + dVar12 * dVar12;
    dVar11 = dVar11 + dVar12 * dVar12 * (double)fVar2;
    pwVar6 = weights->_begin;
  }
  *lastj = 0;
  if (all->quiet != false) {
    return;
  }
  fprintf(_stderr,"%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t",
          dVar10 / (importance_weight_sum * importance_weight_sum),dVar11 / importance_weight_sum,""
          ,"","");
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}